

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O3

void __thiscall my_form::my_form(my_form *this)

{
  text *this_00;
  numeric<double> *this_01;
  password *this_02;
  textarea *this_03;
  select_multiple *this_04;
  radio *this_05;
  select *this_06;
  file *this_07;
  long lVar1;
  password *ppVar2;
  undefined8 local_188;
  char *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158 [16];
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [16];
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118 [16];
  regex *local_108;
  password *local_100;
  regex local_f8 [8];
  hidden *local_f0;
  numeric<double> *local_e8;
  text *local_e0;
  textarea *local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  cppcms::form::form(&this->super_form);
  *(undefined ***)this = &PTR_render_0012a6f0;
  this_00 = &this->name;
  cppcms::widgets::text::text(this_00);
  this_01 = &this->age;
  local_e0 = this_00;
  cppcms::widgets::numeric<double>::numeric(this_01);
  local_100 = &this->p1;
  local_e8 = this_01;
  cppcms::widgets::password::password(local_100);
  this_02 = &this->p2;
  cppcms::widgets::password::password(this_02);
  this_03 = &this->description;
  cppcms::widgets::textarea::textarea(this_03);
  this_04 = &this->sel;
  local_d8 = this_03;
  cppcms::widgets::select_multiple::select_multiple(this_04);
  this_05 = &this->sel1;
  cppcms::widgets::radio::radio(this_05);
  this_06 = &this->sel2;
  cppcms::widgets::select::select(this_06);
  this_07 = &this->gif;
  cppcms::widgets::file::file(this_07);
  local_108 = (regex *)&this->text;
  cppcms::widgets::file::file((file *)local_108);
  local_f0 = &this->secret;
  cppcms::widgets::hidden::hidden(local_f0);
  lVar1 = *(long *)(*(long *)this_00 + -0x18);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Your Name","");
  cppcms::widgets::base_widget::message(this_00 + lVar1,local_50);
  ppVar2 = local_100;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  cppcms::widgets::base_text::limits((int)this + 0x60,2);
  lVar1 = *(long *)(*(long *)this_01 + -0x18);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Your Age","");
  cppcms::widgets::base_widget::message(&this_01->super_base_html_input + lVar1,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  (this->age).check_low_ = true;
  (this->age).check_high_ = true;
  *(undefined4 *)&(this->age).min_ = 0;
  *(undefined4 *)((long)&(this->age).min_ + 4) = 0;
  *(undefined4 *)&(this->age).max_ = 0;
  *(undefined4 *)((long)&(this->age).max_ + 4) = 0x405e0000;
  (this->age).non_empty_ = true;
  lVar1 = *(long *)(*(long *)&this->description + -0x18);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Describe Yourself","");
  cppcms::widgets::base_widget::message(this_03 + lVar1,local_90);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  lVar1 = *(long *)(*(long *)ppVar2 + -0x18);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Password","");
  cppcms::widgets::base_widget::message(ppVar2 + lVar1,local_b0);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  lVar1 = *(long *)(*(long *)this_02 + -0x18);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Confirm","");
  cppcms::widgets::base_widget::message(this_02 + lVar1,local_d0);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  cppcms::widgets::password::check_equal(ppVar2);
  cppcms::widgets::base_text::non_empty();
  local_188 = (undefined8 *)((ulong)local_188._4_4_ << 0x20);
  local_180 = "Files:";
  local_178 = 0;
  uStack_170 = 0;
  local_160 = 0;
  local_158[0] = 0;
  local_140 = 0;
  local_138[0] = 0;
  local_120 = 0;
  local_118[0] = 0;
  local_168 = local_158;
  local_148 = local_138;
  local_128 = local_118;
  cppcms::widgets::base_widget::message((basic_message *)this_04);
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Foo","");
  cppcms::widgets::select_multiple::add((string *)this_04,SUB81(&local_188,0));
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Bar","");
  cppcms::widgets::select_multiple::add((string *)this_04,SUB81(&local_188,0));
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Bee","");
  cppcms::widgets::select_multiple::add((string *)this_04,SUB81(&local_188,0));
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Car","");
  cppcms::widgets::select_multiple::add((string *)this_04,SUB81(&local_188,0));
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = (undefined8 *)((ulong)local_188 & 0xffffffff00000000);
  local_180 = "Fruit";
  local_178 = 0;
  uStack_170 = 0;
  local_160 = 0;
  local_158[0] = 0;
  local_140 = 0;
  local_138[0] = 0;
  local_120 = 0;
  local_118[0] = 0;
  local_168 = local_158;
  local_148 = local_138;
  local_128 = local_118;
  cppcms::widgets::base_widget::message((basic_message *)this_05);
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Apple","");
  cppcms::widgets::select_base::add((string *)this_05);
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Orange","");
  cppcms::widgets::select_base::add((string *)this_05);
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = (undefined8 *)((ulong)local_188 & 0xffffffff00000000);
  local_180 = "Sex";
  local_178 = 0;
  uStack_170 = 0;
  local_160 = 0;
  local_158[0] = 0;
  local_140 = 0;
  local_138[0] = 0;
  local_120 = 0;
  local_118[0] = 0;
  local_168 = local_158;
  local_148 = local_138;
  local_128 = local_118;
  cppcms::widgets::base_widget::message((basic_message *)this_06);
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Male","");
  cppcms::widgets::select_base::add((string *)this_06);
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Femail","");
  cppcms::widgets::select_base::add((string *)this_06);
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"You are sexist","");
  cppcms::widgets::select_base::add((string *)this_06);
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  cppcms::widgets::select_multiple::at_least((uint)this_04);
  cppcms::widgets::select_base::non_empty();
  cppcms::widgets::file::non_empty();
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"GIF89a","");
  cppcms::widgets::file::add_valid_magic((string *)this_07);
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"GIF87a","");
  cppcms::widgets::file::add_valid_magic((string *)this_07);
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,anon_var_dwarf_dd77,anon_var_dwarf_dd77 + 8);
  cppcms::widgets::file::add_valid_magic((string *)this_07);
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"text/.*","");
  booster::regex::regex(local_f8,(string *)&local_188,0);
  cppcms::widgets::file::mime(local_108);
  booster::regex::~regex(local_f8);
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  return;
}

Assistant:

my_form()
	{
		name.message("Your Name");
		name.limits(2,30);
		age.message("Your Age");
		age.range(0,120);
		description.message("Describe Yourself");
		p1.message("Password");
		p2.message("Confirm");
		p1.check_equal(p2);
		p1.non_empty();
		sel.message(cppcms::locale::translate("Files:"));
		sel.add("Foo");
		sel.add("Bar");
		sel.add("Bee");
		sel.add("Car");
		sel1.message(cppcms::locale::translate("Fruit"));
		sel1.add("Apple");
		sel1.add("Orange");
		sel2.message(cppcms::locale::translate("Sex"));
		sel2.add("Male");
		sel2.add("Femail");
		sel2.add("You are sexist");
		sel.at_least(2);
		sel1.non_empty();
		gif.non_empty();
		gif.add_valid_magic("GIF89a");
		gif.add_valid_magic("GIF87a");
		gif.add_valid_magic("\x89PNG\r\n\x1a\n");
		text.mime(booster::regex("text/.*"));
		add(name);
		add(age);
		add(p1);
		add(p2);
		add(description);
		add(sel);
		add(sel1);
		add(sel2);
		add(gif);
		add(text);
		add(secret);
	}